

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O3

void __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>::TCompactProtocolT
          (TCompactProtocolT<duckdb::SimpleReadTransport> *this,
          shared_ptr<duckdb::SimpleReadTransport> *trans,int32_t string_limit,
          int32_t container_limit)

{
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_30;
  
  local_30.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &((trans->super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->super_TTransport;
  local_30.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (trans->super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.
       super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ::TVirtualProtocol(&this->
                      super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                     ,&local_30);
  if (local_30.
      super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->
  super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ).super_TProtocolDefaults.super_TProtocol._vptr_TProtocol =
       (_func_int **)&PTR__TCompactProtocolT_0247dfa0;
  this->trans_ = (trans->super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<short,_std::allocator<short>_>::_M_initialize_map
            ((_Deque_base<short,_std::allocator<short>_> *)&this->lastField_,0);
  this->lastFieldId_ = 0;
  this->string_limit_ = string_limit;
  this->string_buf_ = (uint8_t *)0x0;
  this->string_buf_size_ = 0;
  this->container_limit_ = container_limit;
  (this->booleanField_).name = (char *)0x0;
  (this->boolValue_).hasBoolValue = false;
  return;
}

Assistant:

TCompactProtocolT(std::shared_ptr<Transport_> trans,
                    int32_t string_limit,
                    int32_t container_limit)
    : TVirtualProtocol<TCompactProtocolT<Transport_> >(trans),
      trans_(trans.get()),
      lastFieldId_(0),
      string_limit_(string_limit),
      string_buf_(nullptr),
      string_buf_size_(0),
      container_limit_(container_limit) {
    booleanField_.name = nullptr;
    boolValue_.hasBoolValue = false;
  }